

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O0

void __thiscall
piece_data::do_quiet(piece_data *this,Color *c,Piece *p,Square *f,Square *t,info *ifo)

{
  int iVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  ulong uVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_00;
  reference pvVar11;
  reference this_01;
  reference this_02;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  U64 UVar15;
  int idx;
  U64 fto;
  info *ifo_local;
  Square *t_local;
  Square *f_local;
  Piece *p_local;
  Color *c_local;
  piece_data *this_local;
  
  uVar5 = (&bitboards::squares)[*f];
  uVar6 = (&bitboards::squares)[*t];
  pvVar7 = std::array<std::array<std::array<int,_64UL>,_6UL>,_2UL>::operator[]
                     (&this->piece_idx,(ulong)*c);
  pvVar8 = std::array<std::array<int,_64UL>,_6UL>::operator[](pvVar7,(ulong)*p);
  pvVar9 = std::array<int,_64UL>::operator[](pvVar8,(ulong)*f);
  iVar1 = *pvVar9;
  pvVar7 = std::array<std::array<std::array<int,_64UL>,_6UL>,_2UL>::operator[]
                     (&this->piece_idx,(ulong)*c);
  pvVar8 = std::array<std::array<int,_64UL>,_6UL>::operator[](pvVar7,(ulong)*p);
  pvVar9 = std::array<int,_64UL>::operator[](pvVar8,(ulong)*f);
  *pvVar9 = 0;
  pvVar7 = std::array<std::array<std::array<int,_64UL>,_6UL>,_2UL>::operator[]
                     (&this->piece_idx,(ulong)*c);
  pvVar8 = std::array<std::array<int,_64UL>,_6UL>::operator[](pvVar7,(ulong)*p);
  pvVar9 = std::array<int,_64UL>::operator[](pvVar8,(ulong)*t);
  *pvVar9 = iVar1;
  pvVar10 = std::array<unsigned_long,_2UL>::operator[](&this->bycolor,(ulong)*c);
  *pvVar10 = (uVar5 | uVar6) ^ *pvVar10;
  this_00 = std::array<std::array<unsigned_long,_64UL>,_2UL>::operator[](&this->bitmap,(ulong)*c);
  pvVar11 = std::array<unsigned_long,_64UL>::operator[](this_00,(ulong)*p);
  *pvVar11 = (uVar5 | uVar6) ^ *pvVar11;
  vVar2 = *t;
  this_01 = std::array<std::array<std::array<Square,_11UL>,_6UL>,_2UL>::operator[]
                      (&this->square_of,(ulong)*c);
  this_02 = std::array<std::array<Square,_11UL>,_6UL>::operator[](this_01,(ulong)*p);
  pvVar12 = std::array<Square,_11UL>::operator[](this_02,(long)iVar1);
  *pvVar12 = vVar2;
  pvVar13 = std::array<Color,_64UL>::operator[](&this->color_on,(ulong)*f);
  *pvVar13 = no_color;
  vVar3 = *c;
  pvVar13 = std::array<Color,_64UL>::operator[](&this->color_on,(ulong)*t);
  *pvVar13 = vVar3;
  vVar4 = *p;
  pvVar14 = std::array<Piece,_64UL>::operator[](&this->piece_on,(ulong)*t);
  *pvVar14 = vVar4;
  pvVar14 = std::array<Piece,_64UL>::operator[](&this->piece_on,(ulong)*f);
  *pvVar14 = no_piece;
  uVar5 = ifo->key;
  UVar15 = zobrist::piece(f,c,p);
  ifo->key = uVar5 ^ UVar15;
  uVar5 = ifo->key;
  UVar15 = zobrist::piece(t,c,p);
  ifo->key = uVar5 ^ UVar15;
  uVar5 = ifo->repkey;
  UVar15 = zobrist::piece(f,c,p);
  ifo->repkey = uVar5 ^ UVar15;
  uVar5 = ifo->repkey;
  UVar15 = zobrist::piece(t,c,p);
  ifo->repkey = uVar5 ^ UVar15;
  if (*p == pawn) {
    uVar5 = ifo->pawnkey;
    UVar15 = zobrist::piece(f,c,p);
    ifo->pawnkey = uVar5 ^ UVar15;
    uVar5 = ifo->pawnkey;
    UVar15 = zobrist::piece(t,c,p);
    ifo->pawnkey = uVar5 ^ UVar15;
  }
  return;
}

Assistant:

inline void piece_data::do_quiet(const Color& c, const Piece& p,
	const Square& f, const Square& t, info& ifo) {

	// bitmaps
	U64 fto = bitboards::squares[f] | bitboards::squares[t];

	int idx = piece_idx[c][p][f];
	piece_idx[c][p][f] = 0;
	piece_idx[c][p][t] = idx;

	bycolor[c] ^= fto;
	bitmap[c][p] ^= fto;

	square_of[c][p][idx] = t;
	color_on[f] = no_color;
	color_on[t] = c;

	piece_on[t] = p;
	piece_on[f] = no_piece;

	ifo.key = ifo.key ^ zobrist::piece(f, c, p);
	ifo.key = ifo.key ^ zobrist::piece(t, c, p);

	ifo.repkey = ifo.repkey ^ zobrist::piece(f, c, p);
	ifo.repkey = ifo.repkey ^ zobrist::piece(t, c, p);

	if (p == Piece::pawn) {
		ifo.pawnkey = ifo.pawnkey ^ zobrist::piece(f, c, p);
		ifo.pawnkey = ifo.pawnkey ^ zobrist::piece(t, c, p);
	}
}